

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall rw::Texture::destroy(Texture *this)

{
  Texture *__filename;
  Texture *this_local;
  
  this->refCount = this->refCount + -1;
  if (this->refCount < 1) {
    __filename = this;
    PluginList::destruct((PluginList *)&s_plglist,this);
    if (this->dict != (TexDictionary *)0x0) {
      LLLink::remove(&this->inDict,(char *)__filename);
    }
    if (this->raster != (Raster *)0x0) {
      Raster::destroy(this->raster);
    }
    LLLink::remove(&this->inGlobalList,(char *)__filename);
    (*DAT_001660a8)(this);
    numAllocated = numAllocated + -1;
  }
  return;
}

Assistant:

void
Texture::destroy(void)
{
	this->refCount--;
	if(this->refCount <= 0){
		s_plglist.destruct(this);
		if(this->dict)
			this->inDict.remove();
		if(this->raster)
			this->raster->destroy();
		this->inGlobalList.remove();
		rwFree(this);
		numAllocated--;
	}
}